

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O0

void __thiscall
cmsys::Encoding::CommandLineArguments::CommandLineArguments
          (CommandLineArguments *this,CommandLineArguments *other)

{
  size_type sVar1;
  const_reference ppcVar2;
  reference ppcVar3;
  undefined8 local_50;
  undefined8 local_30;
  size_t i;
  CommandLineArguments *other_local;
  CommandLineArguments *this_local;
  
  std::vector<char_*,_std::allocator<char_*>_>::vector(&this->argv_);
  sVar1 = std::vector<char_*,_std::allocator<char_*>_>::size(&other->argv_);
  std::vector<char_*,_std::allocator<char_*>_>::resize(&this->argv_,sVar1);
  local_30 = 0;
  while( true ) {
    sVar1 = std::vector<char_*,_std::allocator<char_*>_>::size(&this->argv_);
    if (sVar1 <= local_30) break;
    ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&other->argv_,local_30);
    if (*ppcVar2 == (value_type)0x0) {
      local_50 = (char *)0x0;
    }
    else {
      ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&other->argv_,local_30);
      local_50 = strdup(*ppcVar2);
    }
    ppcVar3 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&this->argv_,local_30);
    *ppcVar3 = local_50;
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

Encoding::CommandLineArguments::
  CommandLineArguments(const CommandLineArguments& other)
{
  this->argv_.resize(other.argv_.size());
  for(size_t i=0; i<this->argv_.size(); i++)
    {
    this->argv_[i] = other.argv_[i] ? strdup(other.argv_[i]) : 0;
    }
}